

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_data.cc
# Opt level: O0

void re2c::keygen<unsigned_short>
               (FILE *f,size_t count,size_t len,size_t len_match,rule_rank_t match)

{
  undefined1 auVar1 [16];
  unsigned_short n;
  unsigned_short uVar2;
  ulong __n;
  ulong uVar3;
  void *__ptr;
  uint uVar4;
  undefined4 local_4c;
  uint32_t i;
  unsigned_short *keys;
  size_t keys_size;
  unsigned_short m;
  size_t len_match_local;
  size_t len_local;
  size_t count_local;
  FILE *f_local;
  rule_rank_t match_local;
  
  n = Skeleton::rule2key<unsigned_short>(match);
  __n = count * 3;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = __n;
  uVar3 = SUB168(auVar1 * ZEXT816(2),0);
  if (SUB168(auVar1 * ZEXT816(2),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  __ptr = operator_new__(uVar3);
  local_4c = 0;
  while (local_4c < __n) {
    uVar2 = to_le<unsigned_short>((unsigned_short)len);
    *(unsigned_short *)((long)__ptr + (ulong)local_4c * 2) = uVar2;
    uVar2 = to_le<unsigned_short>((unsigned_short)len_match);
    uVar4 = local_4c + 2;
    *(unsigned_short *)((long)__ptr + (ulong)(local_4c + 1) * 2) = uVar2;
    uVar2 = to_le<unsigned_short>(n);
    local_4c = local_4c + 3;
    *(unsigned_short *)((long)__ptr + (ulong)uVar4 * 2) = uVar2;
  }
  fwrite(__ptr,2,__n,(FILE *)f);
  if (__ptr != (void *)0x0) {
    operator_delete__(__ptr);
  }
  return;
}

Assistant:

static void keygen (FILE * f, size_t count, size_t len, size_t len_match, rule_rank_t match)
{
	const key_t m = Skeleton::rule2key<key_t> (match);

	const size_t keys_size = 3 * count;
	key_t * keys = new key_t [keys_size];
	for (uint32_t i = 0; i < keys_size;)
	{
		keys[i++] = to_le<key_t>(static_cast<key_t> (len));
		keys[i++] = to_le<key_t>(static_cast<key_t> (len_match));
		keys[i++] = to_le<key_t>(m);
	}
	fwrite (keys, sizeof (key_t), keys_size, f);
	delete [] keys;
}